

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

bool libcellml::isEuropeanNumericCharacter(char c)

{
  initializer_list<char> __l;
  bool bVar1;
  _Self local_80;
  _Self local_78 [3];
  allocator_type local_5c;
  less<char> local_5b;
  char local_5a [10];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<char,_std::less<char>,_std::allocator<char>_> validIntegerCharacters;
  char c_local;
  
  builtin_strncpy(local_5a,"0123456789",10);
  local_50 = local_5a;
  local_48 = 10;
  validIntegerCharacters._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = c;
  std::allocator<char>::allocator();
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40,__l,&local_5b,&local_5c);
  std::allocator<char>::~allocator(&local_5c);
  local_78[0]._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::find
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40,
                  (key_type_conflict1 *)
                  ((long)&validIntegerCharacters._M_t._M_impl.super__Rb_tree_header._M_node_count +
                  7));
  local_80._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::end
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40);
  bVar1 = std::operator!=(local_78,&local_80);
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40);
  return bVar1;
}

Assistant:

bool isEuropeanNumericCharacter(char c)
{
    const std::set<char> validIntegerCharacters = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9'};
    return validIntegerCharacters.find(c) != validIntegerCharacters.end();
}